

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int output_bytes(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,void *bytes,size_t length)

{
  int local_2c;
  int result;
  size_t length_local;
  void *bytes_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  if (encoder_output == (AMQPVALUE_ENCODER_OUTPUT)0x0) {
    local_2c = 0;
  }
  else {
    local_2c = (*encoder_output)(context,(uchar *)bytes,length);
  }
  return local_2c;
}

Assistant:

static int output_bytes(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const void* bytes, size_t length)
{
    int result;

    if (encoder_output != NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_267: [amqpvalue_encode shall pass the encoded bytes to the encoder_output function.] */
        /* Codes_SRS_AMQPVALUE_01_268: [On each call to the encoder_output function, amqpvalue_encode shall also pass the context argument.] */
        result = encoder_output(context, (const unsigned char*)bytes, length);
    }
    else
    {
        result = 0;
    }

    return result;
}